

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BytecodeTranslator.cpp
# Opt level: O1

void __thiscall BytecodeTranslator::translate(BytecodeTranslator *this,ifstream *i,ofstream *o)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  _Alloc_hider _Var4;
  char cVar5;
  int iVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  mapped_type *pmVar8;
  float *pfVar9;
  int *piVar10;
  mapped_type_conflict *pmVar11;
  undefined8 uVar12;
  pointer pbVar13;
  mapped_type_conflict mVar14;
  long lVar15;
  ulong uVar16;
  ofstream *poVar17;
  float fVar18;
  uint8_t opcode;
  uint labelID;
  uint varID;
  string s;
  float val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string comment;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  vars;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  labels;
  mapped_type local_119;
  undefined8 local_118;
  float local_10c;
  string local_108;
  float local_e4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  ofstream *local_c8;
  int *local_c0;
  long *local_b8;
  string *local_b0;
  long local_a8 [2];
  ulong local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_60;
  
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"//","");
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  mVar14 = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar15 = *(long *)i;
  lVar2 = *(long *)(lVar15 + -0x18);
  local_c8 = o;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (((byte)i[lVar2 + 0x20] & 2) == 0) {
    do {
      local_108._M_string_length = 0;
      local_108.field_2._M_local_buf[0] = '\0';
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      cVar5 = std::ios::widen((char)*(undefined8 *)(lVar15 + -0x18) + (char)i);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)i,(string *)&local_108,cVar5);
      _Var4._M_p = local_108._M_dataplus._M_p;
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<std::unary_negate<std::pointer_to_unary_function<int,int>>>>
                        (local_108._M_dataplus._M_p,
                         local_108._M_dataplus._M_p + local_108._M_string_length,isspace);
      uVar16 = (long)_Var4._M_p - (long)local_108._M_dataplus._M_p;
      if (local_108._M_dataplus._M_p + local_108._M_string_length == _Var7._M_current) {
        local_108._M_dataplus._M_p[uVar16] = '\0';
        local_108._M_string_length = uVar16;
      }
      else {
        std::__cxx11::string::_M_erase((ulong)&local_108,uVar16);
      }
      if ((local_108._M_string_length != 0) &&
         (iVar6 = std::__cxx11::string::compare((ulong)&local_108,0,local_b0), iVar6 != 0)) {
        split(&local_e0,&local_108);
        iVar6 = std::__cxx11::string::compare
                          ((char *)local_e0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        if (iVar6 != 0) {
          iVar6 = std::__cxx11::string::compare
                            ((char *)local_e0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
          if (iVar6 == 0) {
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                    *)&local_60,
                                   local_e0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1);
            *pmVar11 = mVar14;
          }
          else {
            mVar14 = mVar14 + 1;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_e0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,
                        CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                 local_108.field_2._M_local_buf[0]) + 1);
      }
      lVar15 = *(long *)i;
      lVar2 = *(long *)(lVar15 + -0x18);
    } while (((byte)i[lVar2 + 0x20] & 2) == 0);
  }
  poVar17 = local_c8;
  std::ios::clear((int)lVar2 + (int)i);
  std::istream::seekg((long)i,_S_beg);
  lVar15 = *(long *)i;
  if (((byte)i[*(long *)(lVar15 + -0x18) + 0x20] & 2) == 0) {
    local_98 = 0;
    do {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      local_108._M_string_length = 0;
      local_108.field_2._M_local_buf[0] = '\0';
      cVar5 = std::ios::widen((char)*(undefined8 *)(lVar15 + -0x18) + (char)i);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)i,(string *)&local_108,cVar5);
      _Var4._M_p = local_108._M_dataplus._M_p;
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<std::unary_negate<std::pointer_to_unary_function<int,int>>>>
                        (local_108._M_dataplus._M_p,
                         local_108._M_dataplus._M_p + local_108._M_string_length,isspace);
      uVar16 = (long)_Var4._M_p - (long)local_108._M_dataplus._M_p;
      if (local_108._M_dataplus._M_p + local_108._M_string_length == _Var7._M_current) {
        local_108._M_dataplus._M_p[uVar16] = '\0';
        local_108._M_string_length = uVar16;
      }
      else {
        std::__cxx11::string::_M_erase((ulong)&local_108,uVar16);
      }
      if ((local_108._M_string_length != 0) &&
         (iVar6 = std::__cxx11::string::compare((ulong)&local_108,0,local_b0), iVar6 != 0)) {
        split(&local_e0,&local_108);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
                               *)op::ops_abi_cxx11_,
                              local_e0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        local_119 = *pmVar8;
        if (local_119 == op::ASSIGN) {
          std::ostream::write((char *)poVar17,(long)&local_119);
          pfVar9 = (float *)std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                          *)&local_90,
                                         local_e0.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 1);
          local_10c = *pfVar9;
          pcVar3 = local_e0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
          piVar10 = __errno_location();
          iVar6 = *piVar10;
          *piVar10 = 0;
          fVar18 = strtof(pcVar3,(char **)&local_118);
          poVar17 = local_c8;
          if ((char *)CONCAT44(local_118._4_4_,(mapped_type_conflict)local_118) != pcVar3) {
            if (*piVar10 == 0) {
              *piVar10 = iVar6;
            }
            else if (*piVar10 == 0x22) goto LAB_00103aa5;
            local_e4 = fVar18;
            std::ostream::write((char *)local_c8,(long)&local_10c);
            std::ostream::write((char *)poVar17,(long)&local_e4);
            goto LAB_0010372e;
          }
          std::__throw_invalid_argument("stof");
LAB_00103aa5:
          std::__throw_out_of_range("stof");
LAB_00103ab1:
          std::__throw_invalid_argument("stof");
LAB_00103abd:
          std::__throw_out_of_range("stof");
LAB_00103ac9:
          std::__throw_invalid_argument("stoul");
LAB_00103ad5:
          std::__throw_invalid_argument("stoul");
LAB_00103ae1:
          std::__throw_out_of_range("stoul");
LAB_00103aed:
          uVar12 = std::__throw_out_of_range("stoul");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,
                            CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                     local_108.field_2._M_local_buf[0]) + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::~_Rb_tree(&local_60);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::~_Rb_tree(&local_90);
          if (local_b8 != local_a8) {
            operator_delete(local_b8,local_a8[0] + 1);
          }
          _Unwind_Resume(uVar12);
        }
        if (local_119 != op::LABEL) {
          if (local_119 == op::GOTO) {
            std::ostream::write((char *)poVar17,(long)&local_119);
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                    *)&local_60,
                                   local_e0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1);
            local_118._0_4_ = *pmVar11;
            std::ostream::write((char *)poVar17,(long)&local_118);
          }
          else if (local_119 == op::MOV) {
            std::ostream::write((char *)poVar17,(long)&local_119);
            pcVar3 = local_e0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
            piVar10 = __errno_location();
            iVar6 = *piVar10;
            *piVar10 = 0;
            uVar16 = strtoul(pcVar3,(char **)&local_118,10);
            if ((char *)CONCAT44(local_118._4_4_,(mapped_type_conflict)local_118) == pcVar3)
            goto LAB_00103ad5;
            if (*piVar10 != 0) {
              if (*piVar10 != 0x22) goto LAB_0010389e;
              goto LAB_00103ae1;
            }
            *piVar10 = iVar6;
LAB_0010389e:
            local_10c = (float)uVar16;
            pcVar3 = local_e0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
            iVar6 = *piVar10;
            *piVar10 = 0;
            uVar16 = strtoul(pcVar3,(char **)&local_118,10);
            poVar17 = local_c8;
            if ((char *)CONCAT44(local_118._4_4_,(mapped_type_conflict)local_118) == pcVar3)
            goto LAB_00103ac9;
            if (*piVar10 == 0) {
              *piVar10 = iVar6;
            }
            else if (*piVar10 == 0x22) goto LAB_00103aed;
            local_e4 = (float)uVar16;
            std::ostream::write((char *)local_c8,(long)&local_10c);
            std::ostream::write((char *)poVar17,(long)&local_e4);
          }
          else if (local_119 == op::VAR) {
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                    *)&local_90,
                                   local_e0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1);
            *pmVar11 = (mapped_type_conflict)local_98;
            local_98 = (ulong)((mapped_type_conflict)local_98 + 4);
          }
          else if (local_119 == op::PUSH) {
            std::ostream::write((char *)poVar17,(long)&local_119);
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                    *)&local_90,
                                   local_e0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1);
            local_118._0_4_ = *pmVar11;
            std::ostream::write((char *)poVar17,(long)&local_118);
          }
          else if (local_119 == op::POP) {
            std::ostream::write((char *)poVar17,(long)&local_119);
            if (0x20 < (ulong)((long)local_e0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_e0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)) {
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                      *)&local_90,
                                     local_e0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1);
              local_118._0_4_ = *pmVar11;
              std::ostream::write((char *)poVar17,(long)&local_118);
            }
          }
          else {
            std::ostream::write((char *)poVar17,(long)&local_119);
            pbVar13 = local_e0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (0x20 < (ulong)((long)local_e0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_e0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)) {
              uVar16 = 1;
              lVar15 = 0x20;
              local_c0 = __errno_location();
              do {
                piVar10 = local_c0;
                pcVar3 = *(char **)((long)&(pbVar13->_M_dataplus)._M_p + lVar15);
                iVar6 = *local_c0;
                *local_c0 = 0;
                fVar18 = strtof(pcVar3,(char **)&local_118);
                poVar17 = local_c8;
                if ((char *)CONCAT44(local_118._4_4_,(mapped_type_conflict)local_118) == pcVar3)
                goto LAB_00103ab1;
                iVar1 = *piVar10;
                if (iVar1 == 0) {
                  *piVar10 = iVar6;
                }
                else if (iVar1 == 0x22) goto LAB_00103abd;
                local_10c = fVar18;
                std::ostream::write((char *)local_c8,(long)&local_10c);
                uVar16 = uVar16 + 1;
                lVar15 = lVar15 + 0x20;
                pbVar13 = local_e0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              } while (uVar16 < (ulong)((long)local_e0.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_e0.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 5));
            }
          }
        }
LAB_0010372e:
        if ((local_119 != op::VAR) && (local_119 != op::LABEL)) {
          std::ostream::write((char *)poVar17,0x1081e8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_e0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,
                        CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                 local_108.field_2._M_local_buf[0]) + 1);
      }
      lVar15 = *(long *)i;
    } while (((byte)i[*(long *)(lVar15 + -0x18) + 0x20] & 2) == 0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_90);
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  return;
}

Assistant:

void BytecodeTranslator::translate(std::ifstream &i, std::ofstream &o) {
#ifdef PRINT_BYTECODE
    std::stringstream ss;
#endif

    std::string comment("//");
    std::map<std::string, unsigned int> vars;
    std::map<std::string, unsigned int> labels;
    unsigned int varOffset = 0;

    unsigned int curOp = 0;
    //read all labels
    while (!i.eof()) {
        std::string s;
        getline(i, s);
        s.erase(s.begin(), std::find_if(s.begin(), s.end(), std::not1(std::ptr_fun<int, int>(std::isspace))));
        if (s.empty() || s.compare(0, comment.size(), comment) == 0) continue;

        std::vector<std::string> tokens = split(s);

        if (tokens[0] == "var")
            continue;
        if (tokens[0] == "label") {
#ifdef BT_DEBUG
            printf("read label %s to OP#%i\n", tokens[1].c_str(), curOp);
#endif
            labels[tokens[1]] = curOp;
            continue;
        }
        curOp++;
    }
    i.clear();
    i.seekg(0, std::ios::beg);

    while (!i.eof()) {
        std::string s;
        getline(i, s);
        s.erase(s.begin(), std::find_if(s.begin(), s.end(), std::not1(std::ptr_fun<int, int>(std::isspace))));
        if (s.empty() || s.compare(0, comment.size(), comment) == 0) continue;
        std::vector<std::string> tokens = split(s);
        uint8_t opcode = op::ops[tokens[0]];

        if (opcode == op::ASSIGN) {
            o.write((char *) &opcode, 1);
            unsigned int varID = vars[tokens[1]];
            float val = std::stof(tokens[2]);
            o.write((char *) &varID, 4);
            o.write((char *) &val, 4);

#ifdef BT_DEBUG
            printf("assign %f -> $%i\n", val, varID);
#endif

#ifdef PRINT_BYTECODE
            ss << std::to_string(opcode) << ' ';
            ss << std::to_string(varID) << ' ';
            ss << std::to_string(varID);
#endif
        } else if (opcode == op::LABEL) {
            //skip
/*            o.write((char *) &opcode, 1);
            o.write((char *) &labels[tokens[1]], 4);
            printf("writing label %i\n", labels[tokens[1]]);*/
        } else if (opcode == op::GOTO) {
            o.write((char *) &opcode, 1);
            unsigned int labelID = labels[tokens[1]];
            o.write((char *) &labelID, 4);

#ifdef BT_DEBUG
            printf("writing goto %i\n", labelID);
#endif

#ifdef PRINT_BYTECODE
            ss << std::to_string(opcode) << ' ';
            ss << std::to_string(labelID);
#endif
        } else if (opcode == op::MOV) {
            o.write((char *) &opcode, 1);
            unsigned int varID1 = (unsigned int) std::stoul(tokens[1]),
                    varID2 = (unsigned int) std::stoul(tokens[2]);
            o.write((char *) &varID1, 4);
            o.write((char *) &varID2, 4);

#ifdef PRINT_BYTECODE
            ss << std::to_string(opcode) << ' ';
            ss << std::to_string(varID1) << ' ';
            ss << std::to_string(varID2);
#endif
        } else if (opcode == op::VAR) {
            vars[tokens[1]] = varOffset;
            varOffset += 4;
        } else if (opcode == op::PUSH) {
            o.write((char *) &opcode, 1);
            unsigned int varID = vars[tokens[1]];
            o.write((char *) &varID, 4);

#ifdef BT_DEBUG
            printf("writing push -> %i\n", varID);
#endif

#ifdef PRINT_BYTECODE
            ss << std::to_string(opcode) << ' ';
            ss << std::to_string(varID);
#endif
        } else if (opcode == op::POP) {
#ifdef PRINT_BYTECODE
            ss << std::to_string(opcode) << ' ';
#endif
            o.write((char *) &opcode, 1);
            if (tokens.size() > 1) {
                unsigned int varID = vars[tokens[1]];
                o.write((char *) &varID, 4);

#ifdef BT_DEBUG
                printf("writing pop -> %i\n", varID);
#endif

#ifdef PRINT_BYTECODE
                ss << std::to_string(varID);
#endif
            }
#ifdef BT_DEBUG
            else printf("writing pop\n");
#endif
        } else {
#ifdef PRINT_BYTECODE
            ss << std::to_string(opcode) << ' ';
#endif
            o.write((char *) &opcode, 1);
            for (int i = 1; i < tokens.size(); i++) {
                float f = std::stof(tokens[i]);
#ifdef PRINT_BYTECODE
                ss << std::to_string(f) << ' ';
#endif
                o.write((char *) &f, 4);
            }
        }
        if (opcode != op::VAR && opcode != op::LABEL) {
#ifdef PRINT_BYTECODE
            ss << '\n';
#endif
            o.write(&lineSeparator, 1);
        }
    }

#ifdef PRINT_BYTECODE
    std::cout << "SS:" << '\n';
    std::cout << ss.str() << '\n';
#endif
}